

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_stages<VkRayTracingPipelineCreateInfoKHR>
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info,ScratchAllocator *alloc,
          VkDevice device,PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          DynamicStateInfo *dynamic_state_info)

{
  VkPipelineShaderStageCreateInfo *__src;
  Impl *__s;
  VkSpecializationInfo *info_00;
  bool bVar1;
  VkPipelineShaderStageCreateInfo *pVVar2;
  size_t sVar3;
  Impl *__dest;
  ptrdiff_t _Num;
  size_t sVar4;
  Impl *this_00;
  long lVar5;
  uint uVar6;
  void *pNext;
  bool local_69;
  void *local_60;
  Impl *local_58;
  VkDevice local_50;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT local_48;
  Impl *local_40;
  DynamicStateInfo *local_38;
  
  local_50 = device;
  local_48 = gsmcii;
  local_40 = this;
  local_38 = dynamic_state_info;
  if ((ulong)info->stageCount == 0) {
    pVVar2 = (VkPipelineShaderStageCreateInfo *)0x0;
  }
  else {
    __src = info->pStages;
    sVar4 = (ulong)info->stageCount * 0x30;
    pVVar2 = (VkPipelineShaderStageCreateInfo *)ScratchAllocator::allocate_raw(alloc,sVar4,0x10);
    if (pVVar2 != (VkPipelineShaderStageCreateInfo *)0x0) {
      memmove(pVVar2,__src,sVar4);
    }
  }
  info->pStages = pVVar2;
  local_69 = info->stageCount == 0;
  if (!local_69) {
    uVar6 = 0;
    lVar5 = 0x28;
    local_58 = (Impl *)alloc;
    do {
      pVVar2 = info->pStages;
      __s = *(Impl **)((long)pVVar2 + lVar5 + -8);
      if (__s == (Impl *)0x0) {
        return local_69;
      }
      this_00 = __s;
      sVar3 = strlen((char *)__s);
      sVar4 = sVar3 + 1;
      if (sVar4 == 0) {
        __dest = (Impl *)0x0;
      }
      else {
        __dest = (Impl *)ScratchAllocator::allocate_raw(alloc,sVar4,0x10);
        this_00 = (Impl *)alloc;
        if (__dest != (Impl *)0x0) {
          this_00 = __dest;
          memmove(__dest,__s,sVar4);
        }
      }
      alloc = &local_58->allocator;
      *(Impl **)((long)pVVar2 + lVar5 + -8) = __dest;
      info_00 = *(VkSpecializationInfo **)((long)&pVVar2->sType + lVar5);
      if (info_00 != (VkSpecializationInfo *)0x0) {
        copy_specialization_info
                  (this_00,info_00,&local_58->allocator,
                   (VkSpecializationInfo **)((long)&pVVar2->sType + lVar5));
      }
      local_60 = (void *)0x0;
      bVar1 = copy_pnext_chain(local_40,*(void **)((long)pVVar2 + lVar5 + -0x20),alloc,&local_60,
                               local_38,0);
      if (!bVar1) {
        return local_69;
      }
      *(void **)((long)pVVar2 + lVar5 + -0x20) = local_60;
      bVar1 = add_module_identifier
                        ((VkPipelineShaderStageCreateInfo *)((long)pVVar2 + lVar5 + -0x28),alloc,
                         local_50,local_48);
      if (!bVar1) {
        return local_69;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x30;
      bVar1 = uVar6 < info->stageCount;
      local_69 = !bVar1;
    } while (bVar1);
  }
  return local_69;
}

Assistant:

bool StateRecorder::Impl::copy_stages(CreateInfo *info, ScratchAllocator &alloc,
                                      VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                      const DynamicStateInfo *dynamic_state_info)
{
	info->pStages = copy(info->pStages, info->stageCount, alloc);
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);

		if (!stage.pName)
			return false;

		stage.pName = copy(stage.pName, strlen(stage.pName) + 1, alloc);
		if (stage.pSpecializationInfo)
			if (!copy_specialization_info(stage.pSpecializationInfo, alloc, &stage.pSpecializationInfo))
				return false;

		const void *pNext = nullptr;
		if (!copy_pnext_chain(stage.pNext, alloc, &pNext, dynamic_state_info, 0))
			return false;

		stage.pNext = pNext;

		if (!add_module_identifier(&stage, alloc, device, gsmcii))
			return false;
	}

	return true;
}